

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_load_all(void)

{
  wchar_t w_00;
  wchar_t h_00;
  term_win *ptVar1;
  wchar_t local_34;
  wchar_t y;
  reversed_save *tgt;
  reversed_save *new_head;
  term_win *cursor;
  reversed_save *reversed_list;
  wchar_t h;
  wchar_t w;
  
  w_00 = Term->wid;
  h_00 = Term->hgt;
  cursor = (term_win *)0x0;
  for (new_head = (reversed_save *)Term->mem; new_head != (reversed_save *)0x0;
      new_head = new_head[5].next) {
    ptVar1 = (term_win *)mem_alloc(0x10);
    *(reversed_save **)ptVar1 = new_head;
    *(term_win **)&ptVar1->cy = cursor;
    cursor = ptVar1;
  }
  while (cursor != (term_win *)0x0) {
    ptVar1 = *(term_win **)&cursor->cy;
    term_win_copy(Term->scr,*(term_win **)cursor,w_00,h_00);
    mem_free(cursor);
    for (local_34 = L'\0'; local_34 < h_00; local_34 = local_34 + L'\x01') {
      Term->x1[local_34] = 0;
      Term->x2[local_34] = w_00 + L'\xffffffff';
    }
    Term->y1 = 0;
    Term->y2 = h_00 + L'\xffffffff';
    Term_fresh();
    cursor = ptVar1;
  }
  if (Term->mem != (term_win *)0x0) {
    ptVar1 = Term->mem;
    Term->mem = Term->mem->next;
    term_win_nuke(ptVar1);
    mem_free(ptVar1);
  }
  Term->saved = Term->saved + 0xff;
  return 0;
}

Assistant:

errr Term_load_all(void)
{
	int w = Term->wid;
	int h = Term->hgt;
	struct reversed_save {
		term_win *saved_mem; struct reversed_save *next;
	} *reversed_list = NULL;
	struct term_win *cursor;

	for (cursor = Term->mem; cursor; cursor = cursor->next) {
		struct reversed_save *new_head = mem_alloc(sizeof(*new_head));

		new_head->saved_mem = cursor;
		new_head->next = reversed_list;
		reversed_list = new_head;
	}

	while (reversed_list) {
		struct reversed_save *tgt = reversed_list;
		int y;

		reversed_list = reversed_list->next;
		term_win_copy(Term->scr, tgt->saved_mem, w, h);
		mem_free(tgt);

		/* Assume change */
		for (y = 0; y < h; y++) {
			/* Assume change */
			Term->x1[y] = 0;
			Term->x2[y] = w - 1;
		}
		Term->y1 = 0;
		Term->y2 = h - 1;

		/* Force a redraw with those contents. */
		Term_fresh();
	}

	/* Drop the most recent save. */
	if (Term->mem) {
		cursor = Term->mem;
		Term->mem = Term->mem->next;
		term_win_nuke(cursor);
		mem_free(cursor);
	}
	Term->saved--;

	/* Success */
	return (0);
}